

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O2

HSL * dlib::assign_pixel_helpers::RGB2HSL(COLOUR c1)

{
  HSL *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = c1.b;
  if (c1.g <= c1.b) {
    dVar4 = c1.g;
  }
  if (c1.r <= dVar4) {
    dVar4 = c1.r;
  }
  dVar1 = c1.b;
  if (c1.b <= c1.g) {
    dVar1 = c1.g;
  }
  if (dVar1 <= c1.r) {
    dVar1 = c1.r;
  }
  dVar2 = dVar1 - dVar4;
  dVar3 = (dVar4 + dVar1) * 0.5;
  in_RDI->l = dVar3;
  dVar4 = 0.0;
  dVar5 = 0.0;
  if ((0.0 < dVar3) && (dVar5 = 0.0, dVar3 < 1.0)) {
    dVar5 = dVar2 / (double)(~-(ulong)(dVar3 < 0.5) & (ulong)(2.0 - (dVar3 + dVar3)) |
                            (ulong)(dVar3 + dVar3) & -(ulong)(dVar3 < 0.5));
  }
  in_RDI->s = dVar5;
  if (0.0 < dVar2) {
    dVar4 = (double)(-(ulong)(dVar1 == c1.r) &
                    -(ulong)(dVar1 != c1.g) & (ulong)((c1.g - c1.b) / dVar2 + 0.0));
    dVar4 = (double)(~-(ulong)(dVar1 == c1.g) & (ulong)dVar4 |
                    (-(ulong)(dVar1 != c1.b) & (ulong)((c1.b - c1.r) / dVar2 + 2.0 + dVar4) |
                    ~-(ulong)(dVar1 != c1.b) & (ulong)dVar4) & -(ulong)(dVar1 == c1.g));
    dVar4 = (double)(~-(ulong)(dVar1 == c1.b) & (ulong)dVar4 |
                    ((ulong)((c1.r - c1.g) / dVar2 + 4.0 + dVar4) & -(ulong)(dVar1 != c1.r) |
                    ~-(ulong)(dVar1 != c1.r) & (ulong)dVar4) & -(ulong)(dVar1 == c1.b)) * 60.0;
  }
  in_RDI->h = dVar4;
  return in_RDI;
}

Assistant:

inline HSL RGB2HSL(COLOUR c1)
        {
            double themin,themax,delta;
            HSL c2;
            using namespace std;

            themin = std::min(c1.r,std::min(c1.g,c1.b));
            themax = std::max(c1.r,std::max(c1.g,c1.b));
            delta = themax - themin;
            c2.l = (themin + themax) / 2;
            c2.s = 0;
            if (c2.l > 0 && c2.l < 1)
                c2.s = delta / (c2.l < 0.5 ? (2*c2.l) : (2-2*c2.l));
            c2.h = 0;
            if (delta > 0) {
                if (themax == c1.r && themax != c1.g)
                    c2.h += (c1.g - c1.b) / delta;
                if (themax == c1.g && themax != c1.b)
                    c2.h += (2 + (c1.b - c1.r) / delta);
                if (themax == c1.b && themax != c1.r)
                    c2.h += (4 + (c1.r - c1.g) / delta);
                c2.h *= 60;
            }
            return(c2);
        }